

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_cleanup_aarch64(uc_struct_conflict2 *uc)

{
  int x_00;
  void **p;
  int x;
  int i;
  uc_struct_conflict2 *uc_local;
  
  if ((uc != (uc_struct_conflict2 *)0x0) && (uc->l1_map != (void **)0x0)) {
    x_00 = uc->v_l2_levels;
    if (x_00 < 1) {
      for (p._4_4_ = 0; p._4_4_ < uc->v_l1_size; p._4_4_ = p._4_4_ + 1) {
        if (uc->l1_map[p._4_4_] != (gpointer)0x0) {
          g_free(uc->l1_map[p._4_4_]);
          uc->l1_map[p._4_4_] = (void *)0x0;
        }
      }
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < uc->v_l1_size; p._4_4_ = p._4_4_ + 1) {
        if ((void **)uc->l1_map[p._4_4_] != (void **)0x0) {
          tb_clean_internal((void **)uc->l1_map[p._4_4_],x_00);
          uc->l1_map[p._4_4_] = (void *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void tb_cleanup(struct uc_struct *uc)
{
    int i, x;
    void **p;

    if (uc) {
        if (uc->l1_map) {
            x = uc->v_l2_levels;
            if (x <= 0) {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        g_free(p);
                        uc->l1_map[i] = NULL;
                    }
                }
            } else {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        tb_clean_internal(p, x);
                        uc->l1_map[i] = NULL;
                    }
                }
            }
        }
    }
}